

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtexture.cpp
# Opt level: O0

FTexture * JPEGTexture_TryCreate(FileReader *data,int lumpnum)

{
  FileReader *pFVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  FJPEGTexture *this;
  undefined2 local_20;
  undefined2 local_1e;
  int local_1c;
  anon_union_4_3_c8de7888 first4bytes;
  int lumpnum_local;
  FileReader *data_local;
  
  local_1c = lumpnum;
  _first4bytes = data;
  (*(data->super_FileReaderBase)._vptr_FileReaderBase[4])(data,0,0);
  iVar4 = (*(_first4bytes->super_FileReaderBase)._vptr_FileReaderBase[2])(_first4bytes,&local_20,4);
  if (((3 < CONCAT44(extraout_var,iVar4)) && ((char)local_20 == -1)) && (local_20._1_1_ == -0x28)) {
    uVar2 = local_1e;
    while ((char)local_1e == -1) {
      local_1e._1_1_ = (byte)(uVar2 >> 8);
      local_1e = uVar2;
      if (local_1e._1_1_ - 0xc0 < 3) {
        iVar4 = (*(_first4bytes->super_FileReaderBase)._vptr_FileReaderBase[2])
                          (_first4bytes,&local_20,3);
        if (CONCAT44(extraout_var_02,iVar4) != 3) {
          return (FTexture *)0x0;
        }
        uVar2 = BigShort(local_20);
        if (4 < uVar2) {
          iVar4 = (*(_first4bytes->super_FileReaderBase)._vptr_FileReaderBase[2])
                            (_first4bytes,&local_20,4);
          if (CONCAT44(extraout_var_03,iVar4) == 4) {
            this = (FJPEGTexture *)operator_new(0xa8);
            iVar4 = local_1c;
            uVar2 = BigShort(local_1e);
            uVar3 = BigShort(local_20);
            FJPEGTexture::FJPEGTexture(this,iVar4,(uint)uVar2,(uint)uVar3);
            return &this->super_FTexture;
          }
          return (FTexture *)0x0;
        }
        return (FTexture *)0x0;
      }
      iVar4 = (*(_first4bytes->super_FileReaderBase)._vptr_FileReaderBase[2])
                        (_first4bytes,&local_20,2);
      pFVar1 = _first4bytes;
      if (CONCAT44(extraout_var_00,iVar4) != 2) {
        return (FTexture *)0x0;
      }
      uVar2 = BigShort(local_20);
      (*(pFVar1->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar1,(long)(int)(uVar2 - 2),1);
      iVar4 = (*(_first4bytes->super_FileReaderBase)._vptr_FileReaderBase[2])
                        (_first4bytes,&local_1e,2);
      if (CONCAT44(extraout_var_01,iVar4) != 2) {
        return (FTexture *)0x0;
      }
      uVar2 = local_1e;
    }
  }
  return (FTexture *)0x0;
}

Assistant:

FTexture *JPEGTexture_TryCreate(FileReader & data, int lumpnum)
{
	union
	{
		DWORD dw;
		WORD w[2];
		BYTE b[4];
	} first4bytes;

	data.Seek(0, SEEK_SET);
	if (data.Read(&first4bytes, 4) < 4) return NULL;

	if (first4bytes.b[0] != 0xFF || first4bytes.b[1] != 0xD8 || first4bytes.b[2] != 0xFF)
		return NULL;

	// Find the SOFn marker to extract the image dimensions,
	// where n is 0, 1, or 2 (other types are unsupported).
	while ((unsigned)first4bytes.b[3] - 0xC0 >= 3)
	{
		if (data.Read (first4bytes.w, 2) != 2)
		{
			return NULL;
		}
		data.Seek (BigShort(first4bytes.w[0]) - 2, SEEK_CUR);
		if (data.Read (first4bytes.b + 2, 2) != 2 || first4bytes.b[2] != 0xFF)
		{
			return NULL;
		}
	}
	if (data.Read (first4bytes.b, 3) != 3)
	{
		return NULL;
	}
	if (BigShort (first4bytes.w[0]) < 5)
	{
		return NULL;
	}
	if (data.Read (first4bytes.b, 4) != 4)
	{
		return NULL;
	}
	return new FJPEGTexture (lumpnum, BigShort(first4bytes.w[1]), BigShort(first4bytes.w[0]));
}